

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall re2::NFA::~NFA(NFA *this)

{
  Thread *pTVar1;
  Thread *local_20;
  Thread *t;
  Thread *next;
  NFA *this_local;
  
  if (this->match_ != (char **)0x0) {
    operator_delete__(this->match_);
  }
  if (this->astack_ != (AddState *)0x0) {
    operator_delete__(this->astack_);
  }
  pTVar1 = this->free_threads_;
  while (local_20 = pTVar1, local_20 != (Thread *)0x0) {
    pTVar1 = (local_20->field_0).next;
    if (local_20->capture != (char **)0x0) {
      operator_delete__(local_20->capture);
    }
    if (local_20 != (Thread *)0x0) {
      operator_delete(local_20);
    }
  }
  SparseArray<re2::NFA::Thread_*>::~SparseArray(&this->q1_);
  SparseArray<re2::NFA::Thread_*>::~SparseArray(&this->q0_);
  return;
}

Assistant:

NFA::~NFA() {
  delete[] match_;
  delete[] astack_;
  Thread* next;
  for (Thread* t = free_threads_; t; t = next) {
    next = t->next;
    delete[] t->capture;
    delete t;
  }
}